

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O2

sexp_conflict sexp_fstat_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0)

{
  int iVar1;
  stat *__buf;
  sexp_conflict psVar2;
  sexp_conflict local_38;
  sexp_gc_var_t local_30;
  
  local_30.var = &local_38;
  local_38 = (sexp_conflict)0x43e;
  if ((((ulong)arg0 & 1) == 0) && ((((ulong)arg0 & 2) != 0 || (arg0->tag != 0xc)))) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg0);
    return psVar2;
  }
  local_30.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  __buf = (stat *)calloc(1,0x91);
  if (((ulong)arg0 & 1) == 0) {
    if ((((ulong)arg0 & 2) == 0) && (arg0->tag == 0xc)) {
      iVar1 = (int)(arg0->value).flonum_bits[0] * (int)(arg0->value).uvector.length;
    }
    else {
      iVar1 = 0;
    }
  }
  else {
    iVar1 = (int)((long)arg0 >> 1);
  }
  iVar1 = fstat(iVar1,__buf);
  if (iVar1 == 0) {
    psVar2 = (sexp_conflict)sexp_make_cpointer(ctx,(long)(self->value).type.print >> 1,__buf,0x3e,1)
    ;
  }
  else {
    psVar2 = (sexp_conflict)0x3e;
  }
  (ctx->value).context.saves = local_30.next;
  return psVar2;
}

Assistant:

sexp sexp_fstat_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0) {
  int err = 0;
  struct stat* tmp1;
  sexp res;
  sexp_gc_var1(res1);
  if (! sexp_exact_integerp(arg0))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg0);
  sexp_gc_preserve1(ctx, res1);
  tmp1 = (struct stat*) calloc(1, 1 + sizeof(tmp1[0]));
  err = fstat(sexp_sint_value(arg0), tmp1);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res1 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_opcode_arg2_type(self)), tmp1, SEXP_FALSE, 1);
  res = res1;
  }
  sexp_gc_release1(ctx);
  return res;
}